

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O2

double __thiscall
HEkkDual::computeExactDualObjectiveValue(HEkkDual *this,HVector *dual_col,HVector *dual_row)

{
  double dVar1;
  int iVar2;
  HEkk *pHVar3;
  pointer piVar4;
  double dVar5;
  bool bVar6;
  pointer pdVar7;
  long lVar8;
  HighsInt iCol;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  pHVar3 = this->ekk_instance_;
  HVectorBase<double>::setup(dual_col,(pHVar3->lp_).num_row_);
  HVectorBase<double>::clear(dual_col);
  piVar4 = (dual_col->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (dual_col->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar8 = 0; lVar11 = (long)(pHVar3->lp_).num_row_, lVar8 < lVar11; lVar8 = lVar8 + 1) {
    iVar2 = (pHVar3->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar8];
    if (iVar2 < (pHVar3->lp_).num_col_) {
      dVar1 = (pHVar3->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar2];
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        pdVar7[lVar8] = dVar1;
        iVar2 = dual_col->count;
        dual_col->count = iVar2 + 1;
        piVar4[iVar2] = (int)lVar8;
      }
    }
  }
  iVar2 = (pHVar3->lp_).num_col_;
  HVectorBase<double>::setup(dual_row,iVar2);
  HVectorBase<double>::clear(dual_row);
  if (dual_col->count != 0) {
    HSimplexNla::btran(this->simplex_nla,dual_col,1.0,(HighsTimerClock *)0x0);
    HighsSparseMatrix::priceByColumn(&(pHVar3->lp_).a_matrix_,false,dual_row,dual_col,-2);
  }
  HEkk::computeSimplexDualInfeasible(this->ekk_instance_);
  if (0 < (pHVar3->info_).num_dual_infeasibilities) {
    highsLogDev(&(this->ekk_instance_->options_->super_HighsOptionsStruct).log_options,kInfo,
                "When computing exact dual objective, the unperturbed costs yield num / max / sum dual infeasibilities = %d / %g / %g\n"
                ,(pHVar3->info_).max_dual_infeasibility,(pHVar3->info_).sum_dual_infeasibilities);
  }
  dVar12 = 0.0;
  dVar13 = 0.0;
  dVar14 = 0.0;
  dVar1 = (pHVar3->lp_).offset_;
  for (uVar10 = 0; lVar8 = (long)(pHVar3->lp_).num_col_, (long)uVar10 < lVar8; uVar10 = uVar10 + 1)
  {
    dVar16 = dVar1;
    if ((pHVar3->basis_).nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar10] != '\0') {
      dVar15 = (pHVar3->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar10] -
               (dual_row->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar10];
      dVar16 = (this->ekk_instance_->options_->super_HighsOptionsStruct).small_matrix_value;
      lVar8 = 0x21d0;
      if (-dVar16 <= dVar15) {
        lVar8 = 0x25f0;
      }
      if (dVar16 < dVar15) {
        lVar8 = 0x21b8;
      }
      dVar16 = *(double *)(*(long *)((long)&pHVar3->callback_ + lVar8) + uVar10 * 8);
      bVar6 = highs_isInfinity(ABS(dVar16));
      if (bVar6) {
        return -INFINITY;
      }
      dVar5 = ABS(dVar15 - (pHVar3->info_).workDual_.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar10]);
      if (10000000000.0 < dVar5) {
        highsLogDev(&(this->ekk_instance_->options_->super_HighsOptionsStruct).log_options,kWarning,
                    "Col %4d: ExactDual = %11.4g; WorkDual = %11.4g; Residual = %11.4g\n",dVar15,
                    uVar10 & 0xffffffff);
      }
      dVar12 = dVar12 + ABS(dVar15);
      dVar13 = dVar13 + dVar5;
      dVar15 = dVar15 * dVar16;
      dVar16 = dVar1 + dVar15;
      dVar14 = dVar14 + (dVar1 - (dVar16 - dVar15)) + (dVar15 - (dVar16 - (dVar16 - dVar15)));
    }
    dVar1 = dVar16;
  }
  do {
    if (iVar2 + lVar11 <= lVar8) {
      dVar16 = 1.0;
      if (1.0 <= dVar12) {
        dVar16 = dVar12;
      }
      if (0.001 < dVar13 / dVar16) {
        highsLogDev(&(this->ekk_instance_->options_->super_HighsOptionsStruct).log_options,kWarning,
                    "||exact dual vector|| = %g; ||delta dual vector|| = %g: ratio = %g\n");
      }
      return dVar1 + dVar14;
    }
    dVar16 = dVar1;
    if ((pHVar3->basis_).nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar8] != '\0') {
      uVar9 = (int)lVar8 - (pHVar3->lp_).num_col_;
      dVar15 = (dual_col->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[(int)uVar9];
      dVar16 = (this->ekk_instance_->options_->super_HighsOptionsStruct).small_matrix_value;
      if (dVar15 <= dVar16) {
        if (dVar15 < -dVar16) {
          pdVar7 = (pHVar3->lp_).row_upper_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          goto LAB_0033b240;
        }
        dVar16 = -(pHVar3->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar8];
      }
      else {
        pdVar7 = (pHVar3->lp_).row_lower_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
LAB_0033b240:
        dVar16 = pdVar7[(int)uVar9];
      }
      bVar6 = highs_isInfinity(ABS(dVar16));
      if (bVar6) {
        return -INFINITY;
      }
      dVar5 = ABS(dVar15 + (pHVar3->info_).workDual_.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar8]);
      if (10000000000.0 < dVar5) {
        highsLogDev(&(this->ekk_instance_->options_->super_HighsOptionsStruct).log_options,kWarning,
                    "Row %4d: ExactDual = %11.4g; WorkDual = %11.4g; Residual = %11.4g\n",dVar15,
                    (ulong)uVar9);
      }
      dVar12 = dVar12 + ABS(dVar15);
      dVar13 = dVar13 + dVar5;
      dVar15 = dVar15 * dVar16;
      dVar16 = dVar1 + dVar15;
      dVar14 = dVar14 + (dVar1 - (dVar16 - dVar15)) + (dVar15 - (dVar16 - (dVar16 - dVar15)));
    }
    lVar8 = lVar8 + 1;
    dVar1 = dVar16;
  } while( true );
}

Assistant:

double HEkkDual::computeExactDualObjectiveValue(HVector& dual_col,
                                                HVector& dual_row) {
  const HighsLp& lp = ekk_instance_.lp_;
  const SimplexBasis& basis = ekk_instance_.basis_;
  const HighsSimplexInfo& info = ekk_instance_.info_;
  // Create a local buffer for the pi vector
  dual_col.setup(lp.num_row_);
  dual_col.clear();
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    HighsInt iVar = basis.basicIndex_[iRow];
    if (iVar < lp.num_col_) {
      const double value = lp.col_cost_[iVar];
      if (value) {
        dual_col.array[iRow] = value;
        dual_col.index[dual_col.count++] = iRow;
      }
    }
  }
  // Create a local buffer for the dual vector
  const HighsInt numTot = lp.num_col_ + lp.num_row_;
  dual_row.setup(lp.num_col_);
  dual_row.clear();
  if (dual_col.count) {
    const bool quad_precision = false;
    const double expected_density = 1;
    simplex_nla->btran(dual_col, expected_density);
    lp.a_matrix_.priceByColumn(quad_precision, dual_row, dual_col);
  }
  // Compute dual infeasibilities
  ekk_instance_.computeSimplexDualInfeasible();
  if (info.num_dual_infeasibilities > 0)
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kInfo,
                "When computing exact dual objective, the unperturbed costs "
                "yield num / max / sum dual "
                "infeasibilities = %d / %g / %g\n",
                (int)info.num_dual_infeasibilities, info.max_dual_infeasibility,
                info.sum_dual_infeasibilities);
  HighsCDouble dual_objective = lp.offset_;
  double norm_dual = 0;
  double norm_delta_dual = 0;
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    if (!basis.nonbasicFlag_[iCol]) continue;
    double exact_dual = lp.col_cost_[iCol] - dual_row.array[iCol];
    // The active value must be decided based on the exact dual. For a nonbasic
    // column the bound that must be used may flip due to cost perturbation
    // flipping the sign of its dual and for a basic variable we may need to add
    // to the dual objective using one of the bounds when its dual is not zero.
    double active_value;
    if (exact_dual > ekk_instance_.options_->small_matrix_value)
      active_value = lp.col_lower_[iCol];
    else if (exact_dual < -ekk_instance_.options_->small_matrix_value)
      active_value = lp.col_upper_[iCol];
    else
      active_value = info.workValue_[iCol];

    // when the active value is infinite the dual objective lower bound is
    // -infinity
    if (highs_isInfinity(fabs(active_value))) return -kHighsInf;

    double residual = fabs(exact_dual - info.workDual_[iCol]);
    norm_dual += fabs(exact_dual);
    norm_delta_dual += residual;
    if (residual > 1e10)
      highsLogDev(
          ekk_instance_.options_->log_options, HighsLogType::kWarning,
          "Col %4" HIGHSINT_FORMAT
          ": ExactDual = %11.4g; WorkDual = %11.4g; Residual = %11.4g\n",
          iCol, exact_dual, info.workDual_[iCol], residual);
    dual_objective += active_value * exact_dual;
  }

  for (HighsInt iVar = lp.num_col_; iVar < numTot; iVar++) {
    if (!basis.nonbasicFlag_[iVar]) continue;
    HighsInt iRow = iVar - lp.num_col_;
    double exact_dual = dual_col.array[iRow];
    // Similarly to the column case above the active value must be decided based
    // on the exact dual. For a nonbasic row the bound that must be used
    // may flip due to cost perturbation flipping the sign of its dual and for a
    // basic variable we may need to add to the dual objective using one of the
    // bounds when its dual is not zero.
    double active_value;
    if (exact_dual > ekk_instance_.options_->small_matrix_value)
      active_value = lp.row_lower_[iRow];
    else if (exact_dual < -ekk_instance_.options_->small_matrix_value)
      active_value = lp.row_upper_[iRow];
    else
      active_value = -info.workValue_[iVar];

    // when the active value is infinite the dual objective lower bound is
    // -infinity
    if (highs_isInfinity(fabs(active_value))) return -kHighsInf;

    double residual = fabs(exact_dual + info.workDual_[iVar]);
    norm_dual += fabs(exact_dual);
    norm_delta_dual += residual;
    if (residual > 1e10)
      highsLogDev(
          ekk_instance_.options_->log_options, HighsLogType::kWarning,
          "Row %4" HIGHSINT_FORMAT
          ": ExactDual = %11.4g; WorkDual = %11.4g; Residual = %11.4g\n",
          iRow, exact_dual, info.workDual_[iVar], residual);
    dual_objective += active_value * exact_dual;
  }
  double relative_delta = norm_delta_dual / std::max(norm_dual, 1.0);
  if (relative_delta > 1e-3)
    highsLogDev(
        ekk_instance_.options_->log_options, HighsLogType::kWarning,
        "||exact dual vector|| = %g; ||delta dual vector|| = %g: ratio = %g\n",
        norm_dual, norm_delta_dual, relative_delta);
  return double(dual_objective);
}